

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O3

string * spvDecodeLiteralStringOperand_abi_cxx11_
                   (string *__return_storage_ptr__,spv_parsed_instruction_t *inst,
                   uint16_t operand_index)

{
  uint *puVar1;
  ushort uVar2;
  uint uVar3;
  string *result;
  long lVar4;
  uint *pos;
  uint *puVar5;
  
  if (inst->num_operands <= operand_index) {
    __assert_fail("operand_index < inst.num_operands",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                  ,0x44,
                  "std::string spvDecodeLiteralStringOperand(const spv_parsed_instruction_t &, const uint16_t)"
                 );
  }
  puVar5 = inst->words + inst->operands[operand_index].offset;
  uVar2 = inst->operands[operand_index].num_words;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (uVar2 != 0) {
    puVar1 = puVar5 + uVar2;
    do {
      uVar3 = *puVar5;
      lVar4 = 0;
      do {
        if ((char)(uVar3 >> ((byte)lVar4 & 0x1f)) == '\0') {
          return __return_storage_ptr__;
        }
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        lVar4 = lVar4 + 8;
      } while (lVar4 != 0x20);
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar1);
  }
  __assert_fail("!assert_found_terminating_null && \"Did not find terminating null for the string.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/string_utils.h"
                ,0x65,
                "std::string spvtools::utils::MakeString(InputIt, InputIt, bool) [InputIt = const unsigned int *]"
               );
}

Assistant:

std::string spvDecodeLiteralStringOperand(const spv_parsed_instruction_t& inst,
                                          const uint16_t operand_index) {
  assert(operand_index < inst.num_operands);
  const spv_parsed_operand_t& operand = inst.operands[operand_index];

  return spvtools::utils::MakeString(inst.words + operand.offset,
                                     operand.num_words);
}